

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.h
# Opt level: O0

void gm_alloc_data(AV1_COMP *cpi,GlobalMotionData *gm_data)

{
  void *pvVar1;
  void *in_RSI;
  long in_RDI;
  int m;
  GlobalMotionInfo *gm_info;
  AV1_COMMON *cm;
  int local_24;
  
  pvVar1 = aom_malloc(0x261bd3);
  *(void **)((long)in_RSI + 0x40) = pvVar1;
  if (*(long *)((long)in_RSI + 0x40) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate gm_data->segment_map");
  }
  memset(in_RSI,0,0x40);
  for (local_24 = 0; local_24 < 1; local_24 = local_24 + 1) {
    pvVar1 = aom_malloc(0x261c35);
    *(void **)((long)in_RSI + (long)local_24 * 0x40 + 0x30) = pvVar1;
    if (*(long *)((long)in_RSI + (long)local_24 * 0x40 + 0x30) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate gm_data->motion_models[m].inliers");
    }
  }
  return;
}

Assistant:

static inline void gm_alloc_data(AV1_COMP *cpi, GlobalMotionData *gm_data) {
  AV1_COMMON *cm = &cpi->common;
  GlobalMotionInfo *gm_info = &cpi->gm_info;

  CHECK_MEM_ERROR(cm, gm_data->segment_map,
                  aom_malloc(sizeof(*gm_data->segment_map) *
                             gm_info->segment_map_w * gm_info->segment_map_h));

  av1_zero_array(gm_data->motion_models, RANSAC_NUM_MOTIONS);
  for (int m = 0; m < RANSAC_NUM_MOTIONS; m++) {
    CHECK_MEM_ERROR(cm, gm_data->motion_models[m].inliers,
                    aom_malloc(sizeof(*gm_data->motion_models[m].inliers) * 2 *
                               MAX_CORNERS));
  }
}